

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_IncrementalSolverInterface_T.h
# Opt level: O2

shared_ptr<JointPolicyDiscretePure> __thiscall
BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>::GetNewJpol
          (BGIP_IncrementalSolverInterface_T<JointPolicyPureVector> *this)

{
  int *piVar1;
  long lVar2;
  element_type *peVar3;
  shared_count sVar4;
  JointPolicyPureVector *this_00;
  shared_count extraout_RDX;
  long in_RSI;
  shared_ptr<const_JointPolicyPureVectorForClusteredBG> *this_01;
  shared_ptr<JointPolicyDiscretePure> sVar5;
  shared_ptr<JointPolicyPureVectorForClusteredBG> JPPVfCBG;
  shared_ptr<JointPolicyPureVector> jpol;
  shared_count local_80;
  undefined1 local_78 [16];
  shared_ptr<JointPolicyPureVector> local_68;
  shared_ptr<const_JointPolicyDiscretePure> local_58;
  I_PtPDpure_constPtr local_48;
  shared_ptr<const_JointPolicyPureVectorForClusteredBG> local_38;
  
  this_00 = (JointPolicyPureVector *)operator_new(0x98);
  local_48.px = *(element_type **)(in_RSI + 8);
  local_48.pn.pi_ = *(sp_counted_base **)(in_RSI + 0x10);
  if (*(long *)(in_RSI + 0x10) != 0) {
    LOCK();
    piVar1 = (int *)(*(long *)(in_RSI + 0x10) + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_78 = ZEXT816(0) << 0x20;
  JointPolicyPureVector::JointPolicyPureVector(this_00,&local_48);
  boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>(&local_68,this_00);
  boost::detail::shared_count::~shared_count(&local_48.pn);
  boost::detail::shared_count::~shared_count((shared_count *)(local_78 + 8));
  boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyPureVector>
            ((boost *)local_78,&local_68);
  if (local_78._0_8_ != 0) {
    lVar2 = *(long *)(local_78._0_8_ + 0x88);
    local_80.pi_ = *(sp_counted_base **)(local_78._0_8_ + 0x90);
    if (local_80.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_80.pi_)->use_count_ = (local_80.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_58.px = *(element_type **)(lVar2 + 0x170);
    local_58.pn.pi_ = *(sp_counted_base **)(lVar2 + 0x178);
    if (*(long *)(lVar2 + 0x178) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)(lVar2 + 0x178) + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    boost::detail::shared_count::~shared_count(&local_80);
    this_01 = (shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)(local_78._0_8_ + 0x98);
    boost::
    dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG_const,JointPolicyDiscretePure_const>
              ((boost *)&local_38,&local_58);
    boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::operator=(this_01,&local_38);
    boost::detail::shared_count::~shared_count(&local_38.pn);
    lVar2 = *(long *)(local_78._0_8_ + 0x88);
    local_80.pi_ = *(sp_counted_base **)(local_78._0_8_ + 0x90);
    if (local_80.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_80.pi_)->use_count_ = (local_80.pi_)->use_count_ + 1;
      UNLOCK();
    }
    (**(code **)(*(long *)local_78._0_8_ + 0x10))(local_78._0_8_,*(undefined4 *)(lVar2 + 8));
    boost::detail::shared_count::~shared_count(&local_80);
    boost::detail::shared_count::~shared_count(&local_58.pn);
  }
  sVar4.pi_ = local_68.pn.pi_;
  peVar3 = local_68.px;
  local_68.pn.pi_ = (sp_counted_base *)0x0;
  local_68.px = (element_type *)0x0;
  *(element_type **)&this->super_BGIP_IncrementalSolverInterface = peVar3;
  *(sp_counted_base **)&(this->super_BGIP_IncrementalSolverInterface).field_0x8 = sVar4.pi_;
  boost::detail::shared_count::~shared_count((shared_count *)(local_78 + 8));
  boost::detail::shared_count::~shared_count(&local_68.pn);
  sVar5.pn.pi_ = extraout_RDX.pi_;
  sVar5.px = (element_type *)this;
  return sVar5;
}

Assistant:

virtual boost::shared_ptr<JointPolicyDiscretePure> GetNewJpol() const
    //boost::shared_ptr<JP> GetNewJpol() const
    {
        boost::shared_ptr<JP> jpol = boost::shared_ptr<JP>(new JP(this->GetBGIPI()));
        // check whether it is a
        // JointPolicyPureVectorForClusteredBG, because then we
        // need to store more things
        boost::shared_ptr<JointPolicyPureVectorForClusteredBG> JPPVfCBG=
            boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(jpol);
        if(JPPVfCBG)
        {
            boost::shared_ptr<const JointPolicyDiscretePure> pastJpol =
                JPPVfCBG->GetBG()->GetPastJointPolicyPVFCBG();
            JPPVfCBG->SetPrevJPPVfCBG(
                boost::dynamic_pointer_cast<const JointPolicyPureVectorForClusteredBG>(pastJpol));
            JPPVfCBG->SetDepth(JPPVfCBG->GetBG()->GetStage());
        }
        return(jpol);
    }